

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O2

adios2_error adios2_variable_shapeid(adios2_shapeid *shapeid,adios2_variable *variable)

{
  int iVar1;
  invalid_argument *this;
  allocator local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string
            ((string *)&local_58,"for const adios2_variable, in call to adios2_variable_shapeid",
             (allocator *)&local_98);
  adios2::helper::CheckForNullptr<adios2_variable_const>(variable,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  iVar1 = *(int *)(variable + 0x40);
  std::__cxx11::string::string((string *)&local_78,"in call to adios2_variable_shapeid",&local_99);
  if ((uint)(iVar1 + adios2_shapeid_unknown) < 5) {
    *shapeid = iVar1 + adios2_shapeid_unknown;
    std::__cxx11::string::~string((string *)&local_78);
    return adios2_error_none;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_38,"ERROR: invalid adios2_shapeid, ",&local_78);
  std::operator+(&local_98,&local_38,"\n");
  std::invalid_argument::invalid_argument(this,(string *)&local_98);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

adios2_error adios2_variable_shapeid(adios2_shapeid *shapeid, const adios2_variable *variable)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for const adios2_variable, in call to "
                                                  "adios2_variable_shapeid");
        const adios2::core::VariableBase *variableBase =
            reinterpret_cast<const adios2::core::VariableBase *>(variable);

        *shapeid = adios2_ToShapeID(variableBase->m_ShapeID, "in call to adios2_variable_shapeid");
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_variable_shapeid"));
    }
}